

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O2

void * amqp_pool_alloc(amqp_pool_t *pool,size_t amount)

{
  ulong uVar1;
  ulong __size;
  size_t sVar2;
  int iVar3;
  void *block;
  char *pcVar4;
  ulong __size_00;
  
  if (amount == 0) {
    return (void *)0x0;
  }
  __size_00 = amount + 7 & 0xfffffffffffffff8;
  __size = pool->pagesize;
  if (__size < __size_00) {
    block = calloc(1,__size_00);
    if (block != (void *)0x0) {
      iVar3 = record_pool_block(&pool->large_blocks,block);
      if (iVar3 == 0) {
        return (void *)0x0;
      }
      return block;
    }
LAB_001090e5:
    pcVar4 = (char *)0x0;
  }
  else {
    if (pool->alloc_block != (char *)0x0) {
      sVar2 = pool->alloc_used;
      uVar1 = sVar2 + __size_00;
      if (uVar1 <= __size) {
        pool->alloc_used = uVar1;
        return pool->alloc_block + sVar2;
      }
    }
    iVar3 = pool->next_page;
    if (iVar3 < (pool->pages).num_blocks) {
      pcVar4 = (char *)(pool->pages).blocklist[iVar3];
      pool->alloc_block = pcVar4;
      iVar3 = iVar3 + 1;
    }
    else {
      pcVar4 = (char *)calloc(1,__size);
      pool->alloc_block = pcVar4;
      if ((pcVar4 == (char *)0x0) || (iVar3 = record_pool_block(&pool->pages,pcVar4), iVar3 == 0))
      goto LAB_001090e5;
      iVar3 = (pool->pages).num_blocks;
      pcVar4 = pool->alloc_block;
    }
    pool->next_page = iVar3;
    pool->alloc_used = __size_00;
  }
  return pcVar4;
}

Assistant:

void *amqp_pool_alloc(amqp_pool_t *pool, size_t amount)
{
  if (amount == 0) {
    return NULL;
  }

  amount = (amount + 7) & (~7); /* round up to nearest 8-byte boundary */

  if (amount > pool->pagesize) {
    void *result = calloc(1, amount);
    if (result == NULL) {
      return NULL;
    }
    if (!record_pool_block(&pool->large_blocks, result)) {
      return NULL;
    }
    return result;
  }

  if (pool->alloc_block != NULL) {
    assert(pool->alloc_used <= pool->pagesize);

    if (pool->alloc_used + amount <= pool->pagesize) {
      void *result = pool->alloc_block + pool->alloc_used;
      pool->alloc_used += amount;
      return result;
    }
  }

  if (pool->next_page >= pool->pages.num_blocks) {
    pool->alloc_block = calloc(1, pool->pagesize);
    if (pool->alloc_block == NULL) {
      return NULL;
    }
    if (!record_pool_block(&pool->pages, pool->alloc_block)) {
      return NULL;
    }
    pool->next_page = pool->pages.num_blocks;
  } else {
    pool->alloc_block = pool->pages.blocklist[pool->next_page];
    pool->next_page++;
  }

  pool->alloc_used = amount;

  return pool->alloc_block;
}